

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O2

bool __thiscall
ON_CurveProxy::Split(ON_CurveProxy *this,double t,ON_Curve **left_side,ON_Curve **right_side)

{
  ON_Interval *this_00;
  ON_Interval *this_01;
  ON_Curve *real_curve;
  bool bVar1;
  bool bVar2;
  ON_CurveProxy *this_02;
  ON_CurveProxy *this_03;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double t1;
  ON_Interval right_real_dom;
  ON_Interval left_real_dom;
  ON_Interval right_this_dom;
  ON_Interval left_this_dom;
  ON_Interval d;
  
  this_00 = &this->m_this_domain;
  bVar1 = ON_Interval::IsIncreasing(this_00);
  if (bVar1) {
    this_01 = &this->m_real_curve_domain;
    bVar1 = ON_Interval::IsIncreasing(this_01);
    if ((bVar1) && (bVar1 = ON_Interval::Includes(this_00,t,true), bVar1)) {
      dVar4 = RealCurveParameter(this,t);
      bVar1 = ON_Interval::Includes(this_01,dVar4,true);
      if (bVar1) {
        if ((ON_Object *)*left_side == (ON_Object *)0x0) {
          this_02 = (ON_CurveProxy *)0x0;
        }
        else {
          this_02 = Cast((ON_Object *)*left_side);
          if (this_02 == (ON_CurveProxy *)0x0) {
            return false;
          }
        }
        if ((ON_Object *)*right_side == (ON_Object *)0x0) {
          this_03 = (ON_CurveProxy *)0x0;
        }
        else {
          this_03 = Cast((ON_Object *)*right_side);
          if (this_03 == (ON_CurveProxy *)0x0) {
            return false;
          }
          if (*right_side == *left_side) {
            return false;
          }
        }
        bVar1 = this->m_bReversed;
        ON_Interval::ON_Interval(&left_real_dom);
        ON_Interval::ON_Interval(&right_real_dom);
        if (bVar1 == true) {
          dVar5 = ON_Interval::operator[](this_01,1);
          ON_Interval::Set(&left_real_dom,dVar4,dVar5);
          dVar5 = ON_Interval::operator[](this_01,0);
          t1 = dVar4;
        }
        else {
          dVar5 = ON_Interval::operator[](this_01,0);
          ON_Interval::Set(&left_real_dom,dVar5,dVar4);
          t1 = ON_Interval::operator[](this_01,1);
          dVar5 = dVar4;
        }
        ON_Interval::Set(&right_real_dom,dVar5,t1);
        dVar4 = ON_Interval::operator[](this_00,0);
        ON_Interval::ON_Interval(&left_this_dom,dVar4,t);
        dVar4 = ON_Interval::operator[](this_00,1);
        ON_Interval::ON_Interval(&right_this_dom,t,dVar4);
        bVar2 = ON_Interval::IsIncreasing(&left_real_dom);
        if (!bVar2) {
          return false;
        }
        bVar2 = ON_Interval::IsIncreasing(&right_real_dom);
        if (((bVar2) && (bVar2 = ON_Interval::IsIncreasing(&left_this_dom), bVar2)) &&
           (bVar2 = ON_Interval::IsIncreasing(&right_this_dom), bVar2)) {
          real_curve = this->m_real_curve;
          if (real_curve != (ON_Curve *)0x0) {
            (*(real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(real_curve);
            d.m_t[1] = dVar4;
            bVar2 = ON_Interval::Includes(&d,&left_real_dom,false);
            if (!bVar2) {
              return false;
            }
            bVar2 = ON_Interval::Includes(&d,&right_real_dom,false);
            if (!bVar2) {
              return false;
            }
          }
          if (this_02 == (ON_CurveProxy *)0x0) {
            this_02 = (ON_CurveProxy *)operator_new(0x40);
            ON_CurveProxy(this_02);
          }
          if (this_03 == (ON_CurveProxy *)0x0) {
            this_03 = (ON_CurveProxy *)operator_new(0x40);
            ON_CurveProxy(this_03);
          }
          SetProxyCurve(this_02,real_curve,left_real_dom);
          SetProxyCurve(this_03,real_curve,right_real_dom);
          if (bVar1 != false) {
            (*(this_02->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                      (this_02);
            (*(this_03->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                      (this_03);
          }
          pdVar3 = ON_Interval::operator[](&left_this_dom,0);
          dVar4 = *pdVar3;
          pdVar3 = ON_Interval::operator[](&left_this_dom,1);
          (*(this_02->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (dVar4,*pdVar3,this_02);
          pdVar3 = ON_Interval::operator[](&right_this_dom,0);
          dVar4 = *pdVar3;
          pdVar3 = ON_Interval::operator[](&right_this_dom,1);
          (*(this_03->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (dVar4,*pdVar3,this_03);
          if (*left_side == (ON_Curve *)0x0) {
            *left_side = &this_02->super_ON_Curve;
          }
          if (*right_side == (ON_Curve *)0x0) {
            *right_side = &this_03->super_ON_Curve;
            return true;
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_CurveProxy::Split(
    double t,
    ON_Curve*& left_side,
    ON_Curve*& right_side
  ) const
{
  bool rc = false;
  if ( m_this_domain.IsIncreasing() && m_real_curve_domain.IsIncreasing() && m_this_domain.Includes(t,true) )
  {
    double crv_t = RealCurveParameter(t);
    if ( m_real_curve_domain.Includes(crv_t,true) )
    {
      ON_CurveProxy* left_proxy = 0;
      ON_CurveProxy* right_proxy = 0;
      if ( left_side )
      {
        left_proxy = ON_CurveProxy::Cast(left_side);
        if ( !left_proxy )
          return false;
      }
      if ( right_side )
      {
        right_proxy = ON_CurveProxy::Cast(right_side);
        if ( !right_proxy )
          return false;
        if ( right_side == left_side )
          return false;
      }

      bool bRev = m_bReversed;

      ON_Interval left_real_dom, right_real_dom;
      if ( bRev )
      {
        left_real_dom.Set(crv_t,m_real_curve_domain[1]);
        right_real_dom.Set(m_real_curve_domain[0],crv_t);
      }
      else
      {
        left_real_dom.Set(m_real_curve_domain[0],crv_t);
        right_real_dom.Set(crv_t,m_real_curve_domain[1]);
      }

      ON_Interval left_this_dom(m_this_domain[0],t);
      ON_Interval right_this_dom(t,m_this_domain[1]);

      if (    left_real_dom.IsIncreasing() 
           && right_real_dom.IsIncreasing()
           && left_this_dom.IsIncreasing()
           && right_this_dom.IsIncreasing()
           )
      {
        // note well that left_proxy or right_proxy might also be this
        const ON_Curve* real_crv = m_real_curve;
        if ( real_crv )
        {
          ON_Interval d = real_crv->Domain();
          if ( !d.Includes(left_real_dom) )
            return false;
          if ( !d.Includes(right_real_dom) )
            return false;
        }

        if ( !left_proxy )
          left_proxy = new ON_CurveProxy();
        if ( !right_proxy )
          right_proxy = new ON_CurveProxy();

        left_proxy->SetProxyCurve( real_crv, left_real_dom );
        right_proxy->SetProxyCurve( real_crv, right_real_dom );

        if ( bRev )
        {
          left_proxy->Reverse();
          right_proxy->Reverse();
        }

        left_proxy->SetDomain(left_this_dom[0],left_this_dom[1]);
        right_proxy->SetDomain(right_this_dom[0],right_this_dom[1]);

        if (!left_side) left_side = left_proxy;
        if (!right_side) right_side = right_proxy;

        rc = true;
      }
    }
  }
  return rc;
}